

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

sexp_conflict sexp_gc(sexp_conflict ctx,size_t *sum_freed)

{
  long in_RDI;
  rusage end;
  rusage start;
  sexp_uint_t gc_usecs;
  sexp_conflict finalized;
  sexp_conflict res;
  sexp_conflict in_stack_fffffffffffffeb8;
  sexp_conflict in_stack_fffffffffffffec0;
  sexp_conflict in_stack_ffffffffffffff08;
  sexp_conflict in_stack_ffffffffffffff10;
  sexp_conflict in_stack_ffffffffffffff18;
  rusage local_b8;
  sexp_conflict local_20;
  sexp_conflict local_18;
  long local_8;
  
  local_8 = in_RDI;
  getrusage(RUSAGE_SELF,&local_b8);
  sexp_mark(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  sexp_reset_weak_references(in_stack_ffffffffffffff08);
  local_20 = sexp_finalize(in_stack_ffffffffffffff18);
  local_18 = sexp_sweep(in_stack_ffffffffffffff10,(size_t *)in_stack_ffffffffffffff08);
  *(long *)(local_8 + 0x60b8) = *(long *)(local_8 + 0x60b8) + 1;
  getrusage(RUSAGE_SELF,(rusage *)&stack0xfffffffffffffeb8);
  *(long *)(local_8 + 0x60c0) =
       (long)in_stack_fffffffffffffec0 +
       *(long *)(local_8 + 0x60c0) +
       (((long)in_stack_fffffffffffffeb8 - local_b8.ru_utime.tv_sec) * 1000000 -
       local_b8.ru_utime.tv_usec);
  return local_18;
}

Assistant:

sexp sexp_gc (sexp ctx, size_t *sum_freed) {
  sexp res, finalized SEXP_NO_WARN_UNUSED;
#if SEXP_USE_TIME_GC
  sexp_uint_t gc_usecs;
  struct rusage start, end;
  getrusage(RUSAGE_SELF, &start);
  sexp_debug_printf("%p (heap: %p size: %lu)", ctx, sexp_context_heap(ctx),
                    sexp_heap_total_size(sexp_context_heap(ctx)));
#endif
  sexp_mark_global_symbols(ctx);
  sexp_mark(ctx, ctx);
  sexp_conservative_mark(ctx);
  sexp_reset_weak_references(ctx);
  finalized = sexp_finalize(ctx);
  res = sexp_sweep(ctx, sum_freed);
  ++sexp_context_gc_count(ctx);
#if SEXP_USE_TIME_GC
  getrusage(RUSAGE_SELF, &end);
  gc_usecs = (end.ru_utime.tv_sec - start.ru_utime.tv_sec) * 1000000 +
    end.ru_utime.tv_usec - start.ru_utime.tv_usec;
  sexp_context_gc_usecs(ctx) += gc_usecs;
  sexp_debug_printf("%p (freed: %lu max_freed: %lu finalized: %lu time: %luus)",
                    ctx, (sum_freed ? *sum_freed : 0), sexp_unbox_fixnum(res),
                    sexp_unbox_fixnum(finalized), gc_usecs);
#endif
  return res;
}